

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O0

bool __thiscall
NewEdgeCalculator::checkGaps
          (NewEdgeCalculator *this,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap1,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap2,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *aub)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RCX;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *in_RDX;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *in_RSI;
  bool bVar10;
  bool bVar11;
  bool jump2;
  bool jump1;
  int pos_diff2;
  int pos_diff1;
  int ref_diff;
  value_type *cov_ap2_i1;
  value_type *cov_ap2_i;
  value_type *cov_ap1_i1;
  value_type *cov_ap1_i;
  int i;
  int local_2c;
  
  local_2c = 0;
  while( true ) {
    sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(in_RCX);
    if ((int)sVar4 + -1 <= local_2c) {
      return true;
    }
    pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (in_RCX,(long)local_2c);
    pvVar6 = std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
             operator[](in_RSI,(long)pvVar5->first);
    pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (in_RCX,(long)(local_2c + 1));
    pvVar7 = std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
             operator[](in_RSI,(long)pvVar5->first);
    pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (in_RCX,(long)local_2c);
    pvVar8 = std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
             operator[](in_RDX,(long)pvVar5->second);
    pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (in_RCX,(long)(local_2c + 1));
    pvVar9 = std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
             operator[](in_RDX,(long)pvVar5->second);
    iVar1 = pvVar7->ref - pvVar6->ref;
    iVar2 = pvVar7->pir - pvVar6->pir;
    iVar3 = pvVar9->pir - pvVar8->pir;
    bVar10 = pvVar7->read == pvVar6->read;
    bVar11 = pvVar9->read == pvVar8->read;
    if (((iVar1 == 1) && (iVar2 != iVar3)) && (bVar10 && bVar11)) {
      return false;
    }
    if (((1 < iVar1) && (iVar2 != iVar3)) && (bVar10 && bVar11)) {
      return false;
    }
    if (((1 < iVar1) && (iVar2 == iVar3)) && (1 < iVar2)) break;
    local_2c = local_2c + 1;
  }
  return false;
}

Assistant:

bool NewEdgeCalculator::checkGaps(const std::vector<AlignmentRecord::mapValue> & cov_ap1,const std::vector<AlignmentRecord::mapValue> & cov_ap2,const std::vector<std::pair<int,int>> & aub) const{
    //int num_inserts=0;
    for (int i = 0; i < (signed)aub.size()-1; ++i){
        auto& cov_ap1_i = cov_ap1[aub[i].first];
        auto& cov_ap1_i1 = cov_ap1[aub[i+1].first];
        auto& cov_ap2_i = cov_ap2[aub[i].second];
        auto& cov_ap2_i1 = cov_ap2[aub[i+1].second];

        int ref_diff = cov_ap1_i1.ref-cov_ap1_i.ref;
        int pos_diff1 = cov_ap1_i1.pir-cov_ap1_i.pir; //<0 if jump is given
        int pos_diff2 = cov_ap2_i1.pir-cov_ap2_i.pir; //<0 if jump is given
        bool jump1 = cov_ap1_i1.read-cov_ap1_i.read; //=0/1 for no jump/jump
        bool jump2 = cov_ap2_i1.read-cov_ap2_i.read;
        //insertion
        if(ref_diff == 1 && pos_diff1 != pos_diff2 && (jump1 || jump2) == 0){
            /*if(num_inserts == 0) num_inserts+= pos_diff1-pos_diff2;
            else*/ return false;
        }
        //deletion
        else if(ref_diff > 1 && pos_diff1 != pos_diff2 && (jump1 || jump2) == 0){
            return false;
        }
        else if(ref_diff > 1 && pos_diff1 == pos_diff2 && pos_diff1 > 1){
            return false;
        }
    }
    return true;
}